

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeLoadTxt(xmlXIncludeCtxtPtr ctxt,xmlXIncludeRefPtr ref)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  int newSize;
  xmlXIncludeTxt *tmp;
  int local_70;
  int l;
  int cur;
  xmlParserErrors code;
  xmlChar *content;
  int res;
  int len;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr pctxt;
  xmlCharEncodingHandlerPtr handler;
  xmlChar *encoding;
  int ret;
  int i;
  xmlChar *url;
  xmlNodePtr node;
  xmlParserInputBufferPtr buf;
  xmlXIncludeRefPtr ref_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  url = (xmlChar *)0x0;
  _ret = ref->URI;
  encoding._0_4_ = -1;
  handler = (xmlCharEncodingHandlerPtr)0x0;
  pctxt = (xmlParserCtxtPtr)0x0;
  inputStream = (xmlParserInputPtr)0x0;
  _res = (xmlParserInputPtr)0x0;
  buf = (xmlParserInputBufferPtr)ref;
  ref_local = (xmlXIncludeRefPtr)ctxt;
  if (*_ret == '\0') {
    xmlXIncludeErr(ctxt,ref->elem,0x647,"text serialization of document not available\n",
                   (xmlChar *)0x0);
  }
  else {
    for (encoding._4_4_ = 0; encoding._4_4_ < *(int *)&ref_local->elem;
        encoding._4_4_ = encoding._4_4_ + 1) {
      iVar2 = xmlStrEqual(_ret,*(xmlChar **)(&ref_local->inc->type + (long)encoding._4_4_ * 4));
      if (iVar2 != 0) {
        url = (xmlChar *)
              xmlNewDocText((xmlDoc *)ref_local->URI,
                            (xmlChar *)(&ref_local->inc->_private)[(long)encoding._4_4_ * 2]);
        if ((xmlNodePtr)url == (xmlNodePtr)0x0) {
          xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
        }
        goto LAB_0021b028;
      }
    }
    if (buf->encoder != (xmlCharEncodingHandlerPtr)0x0) {
      handler = (xmlCharEncodingHandlerPtr)
                xmlXIncludeGetProp((xmlXIncludeCtxtPtr)ref_local,(xmlNodePtr)buf->encoder,"encoding"
                                  );
    }
    if ((handler != (xmlCharEncodingHandlerPtr)0x0) &&
       (l = xmlOpenCharEncodingHandler((char *)handler,0,(xmlCharEncodingHandler **)&pctxt),
       l != XML_ERR_OK)) {
      if (l != XML_ERR_NO_MEMORY) {
        if (l == XML_ERR_UNSUPPORTED_ENCODING) {
          xmlXIncludeErr((xmlXIncludeCtxtPtr)ref_local,(xmlNodePtr)buf->encoder,0x64a,
                         "encoding %s not supported\n",(xmlChar *)handler);
        }
        else {
          xmlXIncludeErr((xmlXIncludeCtxtPtr)ref_local,(xmlNodePtr)buf->encoder,l,
                         "unexpected error from iconv or ICU\n",(xmlChar *)0x0);
        }
        goto LAB_0021b043;
      }
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
    }
    inputStream = (xmlParserInputPtr)xmlNewParserCtxt();
    if ((xmlParserCtxtPtr)inputStream == (xmlParserCtxtPtr)0x0) {
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
    }
    else {
      lVar1._0_4_ = ref_local[1].expanding;
      lVar1._4_4_ = ref_local[1].replace;
      if (lVar1 != 0) {
        xmlCtxtSetErrorHandler
                  ((xmlParserCtxtPtr)inputStream,*(xmlStructuredErrorFunc *)&ref_local[1].expanding,
                   ref_local[2].URI);
      }
      if (ref_local[2].fragment != (xmlChar *)0x0) {
        xmlCtxtSetResourceLoader
                  ((xmlParserCtxtPtr)inputStream,(xmlResourceLoader)ref_local[2].fragment,
                   ref_local[2].base);
      }
      _res = xmlLoadResource((xmlParserCtxtPtr)inputStream,(char *)_ret,(char *)0x0,
                             XML_RESOURCE_XINCLUDE_TEXT);
      if (_res == (xmlParserInputPtr)0x0) {
        if (*(int *)&inputStream[1].directory == 2) {
          xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
        }
        else if (((*(int *)&inputStream[1].directory != 0) &&
                 (*(int *)&inputStream[1].directory != 0x5f4)) &&
                (*(int *)&inputStream[1].directory != 0x5dc)) {
          xmlXIncludeErr((xmlXIncludeCtxtPtr)ref_local,(xmlNodePtr)0x0,
                         *(int *)&inputStream[1].directory,"load error",(xmlChar *)0x0);
        }
      }
      else {
        node = (xmlNodePtr)_res->buf;
        if (node != (xmlNodePtr)0x0) {
          if (node->children != (_xmlNode *)0x0) {
            xmlCharEncCloseFunc((xmlCharEncodingHandler *)node->children);
          }
          node->children = (_xmlNode *)pctxt;
          pctxt = (xmlParserCtxtPtr)0x0;
          url = (xmlChar *)xmlNewDocText((xmlDoc *)ref_local->URI,(xmlChar *)0x0);
          if ((xmlNodePtr)url == (xmlNodePtr)0x0) {
            xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
          }
          else {
            do {
              content._0_4_ = xmlParserInputBufferRead((xmlParserInputBufferPtr)node,0x1000);
            } while (0 < (int)content);
            if ((int)content < 0) {
              if (*(int *)((long)&node->next + 4) == 2) {
                xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
              }
              else {
                xmlXIncludeErr((xmlXIncludeCtxtPtr)ref_local,(xmlNodePtr)0x0,
                               *(int *)((long)&node->next + 4),"read error",(xmlChar *)0x0);
              }
            }
            else {
              _cur = xmlBufContent((xmlBuf *)node->last);
              sVar3 = xmlBufUse((xmlBufPtr)node->last);
              content._4_4_ = (int)sVar3;
              for (encoding._4_4_ = 0; encoding._4_4_ < content._4_4_;
                  encoding._4_4_ = tmp._4_4_ + encoding._4_4_) {
                tmp._4_4_ = content._4_4_ - encoding._4_4_;
                local_70 = xmlGetUTF8Char(_cur + encoding._4_4_,(int *)((long)&tmp + 4));
                if (local_70 < 0) {
LAB_0021ae66:
                  xmlXIncludeErr((xmlXIncludeCtxtPtr)ref_local,(xmlNodePtr)buf->encoder,0x648,
                                 "%s contains invalid char\n",_ret);
                  goto LAB_0021b043;
                }
                if (local_70 < 0x100) {
                  if (((local_70 < 9) || (10 < local_70)) &&
                     ((local_70 != 0xd && (local_70 < 0x20)))) goto LAB_0021ae66;
                }
                else if ((((local_70 < 0x100) || (0xd7ff < local_70)) &&
                         ((local_70 < 0xe000 || (0xfffd < local_70)))) &&
                        ((local_70 < 0x10000 || (0x10ffff < local_70)))) goto LAB_0021ae66;
              }
              iVar2 = xmlNodeAddContentLen((xmlNodePtr)url,_cur,content._4_4_);
              if (iVar2 < 0) {
                xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
              }
              if (*(int *)((long)&ref_local->elem + 4) <= *(int *)&ref_local->elem) {
                iVar2 = xmlGrowCapacity(*(int *)((long)&ref_local->elem + 4),0x10,8,1000000000);
                if (iVar2 < 0) {
                  xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
                  goto LAB_0021b043;
                }
                pxVar4 = (xmlNodePtr)(*xmlRealloc)(ref_local->inc,(long)iVar2 << 4);
                if (pxVar4 == (xmlNodePtr)0x0) {
                  xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
                  goto LAB_0021b043;
                }
                *(int *)((long)&ref_local->elem + 4) = iVar2;
                ref_local->inc = pxVar4;
              }
              pxVar5 = xmlStrdup(*(xmlChar **)(url + 0x50));
              (&ref_local->inc->_private)[(long)*(int *)&ref_local->elem * 2] = pxVar5;
              if ((*(long *)(url + 0x50) == 0) ||
                 ((&ref_local->inc->_private)[(long)*(int *)&ref_local->elem * 2] != (void *)0x0)) {
                pxVar5 = xmlStrdup(_ret);
                *(xmlChar **)(&ref_local->inc->type + (long)*(int *)&ref_local->elem * 4) = pxVar5;
                if (*(long *)(&ref_local->inc->type + (long)*(int *)&ref_local->elem * 4) == 0) {
                  xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
                  (*xmlFree)((&ref_local->inc->_private)[(long)*(int *)&ref_local->elem * 2]);
                }
                else {
                  *(int *)&ref_local->elem = *(int *)&ref_local->elem + 1;
LAB_0021b028:
                  buf->buffer = (xmlBufPtr)url;
                  url = (xmlChar *)0x0;
                  encoding._0_4_ = 0;
                }
              }
              else {
                xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)ref_local);
              }
            }
          }
        }
      }
    }
  }
LAB_0021b043:
  xmlFreeNode((xmlNodePtr)url);
  xmlFreeInputStream(_res);
  xmlFreeParserCtxt((xmlParserCtxtPtr)inputStream);
  xmlCharEncCloseFunc((xmlCharEncodingHandler *)pctxt);
  (*xmlFree)(handler);
  return (int)encoding;
}

Assistant:

static int
xmlXIncludeLoadTxt(xmlXIncludeCtxtPtr ctxt, xmlXIncludeRefPtr ref) {
    xmlParserInputBufferPtr buf;
    xmlNodePtr node = NULL;
    const xmlChar *url = ref->URI;
    int i;
    int ret = -1;
    xmlChar *encoding = NULL;
    xmlCharEncodingHandlerPtr handler = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr inputStream = NULL;
    int len;
    int res;
    const xmlChar *content;

    /*
     * Handling of references to the local document are done
     * directly through ctxt->doc.
     */
    if (url[0] == 0) {
	xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_TEXT_DOCUMENT,
		       "text serialization of document not available\n", NULL);
	goto error;
    }

    /*
     * Prevent reloading the document twice.
     */
    for (i = 0; i < ctxt->txtNr; i++) {
	if (xmlStrEqual(url, ctxt->txtTab[i].url)) {
            node = xmlNewDocText(ctxt->doc, ctxt->txtTab[i].text);
            if (node == NULL)
                xmlXIncludeErrMemory(ctxt);
	    goto loaded;
	}
    }

    /*
     * Try to get the encoding if available
     */
    if (ref->elem != NULL) {
	encoding = xmlXIncludeGetProp(ctxt, ref->elem, XINCLUDE_PARSE_ENCODING);
    }
    if (encoding != NULL) {
        xmlParserErrors code;

        code = xmlOpenCharEncodingHandler((const char *) encoding,
                                          /* output */ 0, &handler);

        if (code != XML_ERR_OK) {
            if (code == XML_ERR_NO_MEMORY) {
                xmlXIncludeErrMemory(ctxt);
            } else if (code == XML_ERR_UNSUPPORTED_ENCODING) {
                xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_UNKNOWN_ENCODING,
                               "encoding %s not supported\n", encoding);
                goto error;
            } else {
                xmlXIncludeErr(ctxt, ref->elem, code,
                               "unexpected error from iconv or ICU\n", NULL);
                goto error;
            }
        }
    }

    /*
     * Load it.
     */
    pctxt = xmlNewParserCtxt();
    if (pctxt == NULL) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    if (ctxt->errorHandler != NULL)
        xmlCtxtSetErrorHandler(pctxt, ctxt->errorHandler, ctxt->errorCtxt);
    if (ctxt->resourceLoader != NULL)
        xmlCtxtSetResourceLoader(pctxt, ctxt->resourceLoader,
                                 ctxt->resourceCtxt);

    inputStream = xmlLoadResource(pctxt, (const char*) url, NULL,
                                  XML_RESOURCE_XINCLUDE_TEXT);
    if (inputStream == NULL) {
        /*
         * ENOENT only produces a warning which isn't reflected in errNo.
         */
        if (pctxt->errNo == XML_ERR_NO_MEMORY)
            xmlXIncludeErrMemory(ctxt);
        else if ((pctxt->errNo != XML_ERR_OK) &&
                 (pctxt->errNo != XML_IO_ENOENT) &&
                 (pctxt->errNo != XML_IO_UNKNOWN))
            xmlXIncludeErr(ctxt, NULL, pctxt->errNo, "load error", NULL);
	goto error;
    }
    buf = inputStream->buf;
    if (buf == NULL)
	goto error;
    if (buf->encoder)
	xmlCharEncCloseFunc(buf->encoder);
    buf->encoder = handler;
    handler = NULL;

    node = xmlNewDocText(ctxt->doc, NULL);
    if (node == NULL) {
        xmlXIncludeErrMemory(ctxt);
	goto error;
    }

    /*
     * Scan all chars from the resource and add the to the node
     */
    do {
        res = xmlParserInputBufferRead(buf, 4096);
    } while (res > 0);
    if (res < 0) {
        if (buf->error == XML_ERR_NO_MEMORY)
            xmlXIncludeErrMemory(ctxt);
        else
            xmlXIncludeErr(ctxt, NULL, buf->error, "read error", NULL);
        goto error;
    }

    content = xmlBufContent(buf->buffer);
    len = xmlBufUse(buf->buffer);
    for (i = 0; i < len;) {
        int cur;
        int l;

        l = len - i;
        cur = xmlGetUTF8Char(&content[i], &l);
        if ((cur < 0) || (!IS_CHAR(cur))) {
            xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_INVALID_CHAR,
                           "%s contains invalid char\n", url);
            goto error;
        }

        i += l;
    }

    if (xmlNodeAddContentLen(node, content, len) < 0)
        xmlXIncludeErrMemory(ctxt);

    if (ctxt->txtNr >= ctxt->txtMax) {
        xmlXIncludeTxt *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->txtMax, sizeof(tmp[0]),
                                  8, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
        tmp = xmlRealloc(ctxt->txtTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
        ctxt->txtMax = newSize;
        ctxt->txtTab = tmp;
    }
    ctxt->txtTab[ctxt->txtNr].text = xmlStrdup(node->content);
    if ((node->content != NULL) &&
        (ctxt->txtTab[ctxt->txtNr].text == NULL)) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    ctxt->txtTab[ctxt->txtNr].url = xmlStrdup(url);
    if (ctxt->txtTab[ctxt->txtNr].url == NULL) {
        xmlXIncludeErrMemory(ctxt);
        xmlFree(ctxt->txtTab[ctxt->txtNr].text);
        goto error;
    }
    ctxt->txtNr++;

loaded:
    /*
     * Add the element as the replacement copy.
     */
    ref->inc = node;
    node = NULL;
    ret = 0;

error:
    xmlFreeNode(node);
    xmlFreeInputStream(inputStream);
    xmlFreeParserCtxt(pctxt);
    xmlCharEncCloseFunc(handler);
    xmlFree(encoding);
    return(ret);
}